

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ostream * operator<<(ostream *out,RangeValue *shape)

{
  allocator<char> local_31;
  string local_30 [32];
  
  if (shape->_isUnbound == true) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"inf",&local_31);
    std::operator<<(out,local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    CoreML::RangeValue::value(shape);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const RangeValue& shape) {
    if (shape.isUnbound()) {
        out << std::string("inf");
    }
    else {
        out << shape.value();
    }
    return out;
}